

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# router.cpp
# Opt level: O0

bool __thiscall Router::Reachable(Router *this,Vec2 pos)

{
  reference pvVar1;
  reference pvVar2;
  int local_24;
  int i;
  Router *this_local;
  float fStack_10;
  Vec2 pos_local;
  
  this_local._4_4_ = pos.x;
  if ((((this_local._4_4_ < 0.0) || (60.0 < this_local._4_4_)) ||
      (fStack_10 = pos.y, fStack_10 < 0.0)) || (90.0 < fStack_10)) {
    pos_local.x._3_1_ = false;
  }
  else {
    for (local_24 = 0; local_24 < this->ObstacleCount; local_24 = local_24 + 1) {
      pvVar1 = std::
               vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
               ::operator[](&this->Obstacles,(long)local_24);
      pvVar2 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar1,0);
      if ((pvVar2->x - 0.05) - 0.0001 < this_local._4_4_) {
        pvVar1 = std::
                 vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                 ::operator[](&this->Obstacles,(long)local_24);
        pvVar2 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar1,2);
        if (this_local._4_4_ < pvVar2->x + 0.05 + 0.0001) {
          pvVar1 = std::
                   vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                   ::operator[](&this->Obstacles,(long)local_24);
          pvVar2 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar1,0);
          if ((pvVar2->y - 0.05) - 0.0001 < fStack_10) {
            pvVar1 = std::
                     vector<std::vector<Vec2,_std::allocator<Vec2>_>,_std::allocator<std::vector<Vec2,_std::allocator<Vec2>_>_>_>
                     ::operator[](&this->Obstacles,(long)local_24);
            pvVar2 = std::vector<Vec2,_std::allocator<Vec2>_>::operator[](pvVar1,2);
            if (fStack_10 < pvVar2->y + 0.05 + 0.0001) {
              return false;
            }
          }
        }
      }
    }
    pos_local.x._3_1_ = true;
  }
  return pos_local.x._3_1_;
}

Assistant:

bool Router::Reachable(Vec2 pos)
{
    if (pos.x < 0 || pos.x > MapWidth || pos.y < 0 || pos.y > MapHeight)
        return false;
    for (int i = 0; i < ObstacleCount; ++i)
        if (pos.x > Obstacles[i][0].x - ObsBorder - EPS
            && pos.x < Obstacles[i][2].x + ObsBorder + EPS
            && pos.y > Obstacles[i][0].y - ObsBorder - EPS
            && pos.y < Obstacles[i][2].y + ObsBorder + EPS)
            return false;
    return true;
}